

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O1

void __thiscall helics::InputInfo::setProperty(InputInfo *this,int32_t option,int32_t value)

{
  iterator __position;
  pointer piVar1;
  bool bVar2;
  int local_4;
  
  bVar2 = value != 0;
  if (option < 0x1c6) {
    if (option < 0x199) {
      if (option == 0x18d) {
        this->required = bVar2;
        return;
      }
      if (option == 0x192) {
        this->required = value == 0;
        return;
      }
      if (option != 0x197) {
        return;
      }
      bVar2 = value != 0;
    }
    else {
      if (option != 0x199) {
        if (option == 0x19e) {
          this->strict_type_matching = bVar2;
          return;
        }
        if (option != 0x1bf) {
          return;
        }
        this->ignore_unit_mismatch = bVar2;
        return;
      }
      bVar2 = value == 0;
    }
    this->required_connnections = (uint)bVar2;
    return;
  }
  if (0x1ff < option) {
    if (option == 0x200) {
      piVar1 = (this->priority_sources).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->priority_sources).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish == piVar1) {
        return;
      }
      (this->priority_sources).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar1;
      return;
    }
    if (option != 0x20a) {
      if (option != 0x22d) {
        return;
      }
      (this->minTimeGap).internalTimeCode = (long)value * 1000000;
      return;
    }
    this->required_connnections = value;
    return;
  }
  if (option == 0x1c6) {
    this->only_update_on_change = bVar2;
    return;
  }
  if (option != 0x1db) {
    if (option != 0x1fe) {
      return;
    }
    __position._M_current =
         (this->priority_sources).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current !=
        (this->priority_sources).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      *__position._M_current = value;
      (this->priority_sources).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
      return;
    }
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->priority_sources,__position,&local_4);
    return;
  }
  this->not_interruptible = bVar2;
  return;
}

Assistant:

void InputInfo::setProperty(int32_t option, int32_t value)
{
    bool bvalue = (value != 0);
    switch (option) {
        case defs::Options::IGNORE_INTERRUPTS:
            not_interruptible = bvalue;
            break;
        case defs::Options::HANDLE_ONLY_UPDATE_ON_CHANGE:
            only_update_on_change = bvalue;
            break;
        case defs::Options::CONNECTION_REQUIRED:
            required = bvalue;
            break;
        case defs::Options::CONNECTION_OPTIONAL:
            required = !bvalue;
            break;
        case defs::Options::SINGLE_CONNECTION_ONLY:
            required_connnections = bvalue ? 1 : 0;
            break;
        case defs::Options::MULTIPLE_CONNECTIONS_ALLOWED:
            required_connnections = bvalue ? 0 : 1;
            break;
        case defs::Options::STRICT_TYPE_CHECKING:
            strict_type_matching = bvalue;
            break;
        case defs::Options::IGNORE_UNIT_MISMATCH:
            ignore_unit_mismatch = bvalue;
            break;
        case defs::Options::CONNECTIONS:
            required_connnections = value;
            break;
        case defs::Options::INPUT_PRIORITY_LOCATION:
            priority_sources.push_back(value);
            break;
        case defs::Options::CLEAR_PRIORITY_LIST:
            priority_sources.clear();
            break;
        case defs::Options::TIME_RESTRICTED:
            minTimeGap = Time(value, time_units::ms);
            break;
        default:
            break;
    }
}